

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O0

bool __thiscall llvm::Triple::isOSVersionLT(Triple *this,uint Major,uint Minor,uint Micro)

{
  uint local_30;
  uint local_2c;
  uint LHS [3];
  uint Micro_local;
  uint Minor_local;
  uint Major_local;
  Triple *this_local;
  
  LHS[1] = Micro;
  LHS[2] = Minor;
  getOSVersion(this,&local_30,&local_2c,LHS);
  if (local_30 == Major) {
    if (local_2c == LHS[2]) {
      if (LHS[0] == LHS[1]) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = LHS[0] < LHS[1];
      }
    }
    else {
      this_local._7_1_ = local_2c < LHS[2];
    }
  }
  else {
    this_local._7_1_ = local_30 < Major;
  }
  return this_local._7_1_;
}

Assistant:

bool isOSVersionLT(unsigned Major, unsigned Minor = 0,
                     unsigned Micro = 0) const {
    unsigned LHS[3];
    getOSVersion(LHS[0], LHS[1], LHS[2]);

    if (LHS[0] != Major)
      return LHS[0] < Major;
    if (LHS[1] != Minor)
      return LHS[1] < Minor;
    if (LHS[2] != Micro)
      return LHS[2] < Micro;

    return false;
  }